

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t archive_acl_text_l(archive_acl *acl,wchar_t flags,char **acl_text,size_t *acl_text_len,
                          archive_string_conv *sc)

{
  wchar_t wVar1;
  size_t sVar2;
  size_t *in_RCX;
  undefined1 *puVar3;
  undefined8 *in_RDX;
  uint in_ESI;
  long in_RDI;
  char *p;
  wchar_t r;
  wchar_t id;
  size_t len;
  archive_acl_entry *ap;
  char separator;
  char *prefix;
  char *name;
  size_t length;
  wchar_t count;
  undefined1 *local_78;
  wchar_t in_stack_ffffffffffffff90;
  wchar_t in_stack_ffffffffffffff94;
  size_t *in_stack_ffffffffffffff98;
  char **ppcVar4;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar5;
  char **in_stack_ffffffffffffffb0;
  char *p_00;
  long local_48;
  size_t local_40;
  int local_34;
  wchar_t local_4;
  
  if (*(long *)(in_RDI + 0x28) != 0) {
    free(*(void **)(in_RDI + 0x28));
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  *in_RDX = 0;
  if (in_RCX != (size_t *)0x0) {
    *in_RCX = 0;
  }
  uVar5 = 0x2c;
  local_34 = 0;
  local_40 = 0;
  ppcVar4 = *(char ***)(in_RDI + 8);
  do {
    if (ppcVar4 == (char **)0x0) {
      if ((0 < local_34) && ((in_ESI & 0x100) != 0)) {
        local_40 = local_40 + 0x20;
      }
      if (local_34 == 0) {
        local_4 = L'\0';
      }
      else {
        local_78 = (undefined1 *)malloc(local_40);
        wVar1 = (wchar_t)((ulong)ppcVar4 >> 0x20);
        *(undefined1 **)(in_RDI + 0x28) = local_78;
        if (local_78 == (undefined1 *)0x0) {
          local_4 = L'\xffffffff';
        }
        else {
          if ((in_ESI & 0x100) != 0) {
            append_entry(in_stack_ffffffffffffffb0,(char *)CONCAT17(uVar5,in_stack_ffffffffffffffa8)
                         ,wVar1,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90);
            puVar3 = local_78 + 1;
            *local_78 = 0x2c;
            append_entry(in_stack_ffffffffffffffb0,(char *)CONCAT17(uVar5,in_stack_ffffffffffffffa8)
                         ,wVar1,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90);
            local_78 = local_78 + 2;
            *puVar3 = 0x2c;
            append_entry(in_stack_ffffffffffffffb0,(char *)CONCAT17(uVar5,in_stack_ffffffffffffffa8)
                         ,wVar1,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                         in_stack_ffffffffffffff90);
            for (ppcVar4 = *(char ***)(in_RDI + 8); ppcVar4 != (char **)0x0;
                ppcVar4 = (char **)*ppcVar4) {
              if (((ulong)ppcVar4[1] & 0x100) != 0) {
                in_stack_ffffffffffffff90 =
                     archive_mstring_get_mbs_l
                               ((archive_mstring *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),ppcVar4
                                ,in_stack_ffffffffffffff98,
                                (archive_string_conv *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
                if (in_stack_ffffffffffffff90 != L'\0') {
                  return L'\xffffffff';
                }
                *local_78 = uVar5;
                if ((in_ESI & 0x400) == 0) {
                  in_stack_ffffffffffffff94 = L'\xffffffff';
                }
                else {
                  in_stack_ffffffffffffff94 = *(wchar_t *)((long)ppcVar4 + 0x14);
                }
                append_entry(in_stack_ffffffffffffffb0,
                             (char *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),
                             (wchar_t)((ulong)ppcVar4 >> 0x20),(char *)in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff94,L'\0');
                local_78 = local_78 + 1;
              }
            }
          }
          if ((in_ESI & 0x200) != 0) {
            if ((in_ESI & 0x800) == 0) {
              p_00 = (char *)0x0;
            }
            else {
              p_00 = "default:";
            }
            local_34 = 0;
            for (ppcVar4 = *(char ***)(in_RDI + 8); ppcVar4 != (char **)0x0;
                ppcVar4 = (char **)*ppcVar4) {
              if (((ulong)ppcVar4[1] & 0x200) != 0) {
                in_stack_ffffffffffffff90 =
                     archive_mstring_get_mbs_l
                               ((archive_mstring *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),ppcVar4
                                ,in_stack_ffffffffffffff98,
                                (archive_string_conv *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
                if (in_stack_ffffffffffffff90 != L'\0') {
                  return L'\xffffffff';
                }
                if (0 < local_34) {
                  *local_78 = uVar5;
                  local_78 = local_78 + 1;
                }
                if ((in_ESI & 0x400) == 0) {
                  in_stack_ffffffffffffff94 = L'\xffffffff';
                }
                else {
                  in_stack_ffffffffffffff94 = *(wchar_t *)((long)ppcVar4 + 0x14);
                }
                append_entry((char **)p_00,(char *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),
                             (wchar_t)((ulong)ppcVar4 >> 0x20),(char *)in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff94,L'\0');
                local_34 = local_34 + 1;
              }
            }
          }
          *in_RDX = *(undefined8 *)(in_RDI + 0x28);
          if (in_RCX != (size_t *)0x0) {
            sVar2 = strlen(*(char **)(in_RDI + 0x28));
            *in_RCX = sVar2;
          }
          local_4 = L'\0';
        }
      }
      return local_4;
    }
    if ((*(uint *)(ppcVar4 + 1) & in_ESI) != 0) {
      local_34 = local_34 + 1;
      if (((in_ESI & 0x800) != 0) && (((ulong)ppcVar4[1] & 0x200) != 0)) {
        local_40 = local_40 + 8;
      }
      wVar1 = archive_mstring_get_mbs_l
                        ((archive_mstring *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),ppcVar4,
                         in_stack_ffffffffffffff98,
                         (archive_string_conv *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (wVar1 != L'\0') {
        return L'\xffffffff';
      }
      if ((in_stack_ffffffffffffff98 == (size_t *)0x0) || (local_48 == 0)) {
        local_40 = local_40 + 0x13;
      }
      else {
        local_40 = (long)in_stack_ffffffffffffff98 + local_40 + 6;
      }
      local_40 = local_40 + 0x13;
      in_stack_ffffffffffffff90 = L'\0';
    }
    ppcVar4 = (char **)*ppcVar4;
  } while( true );
}

Assistant:

int
archive_acl_text_l(struct archive_acl *acl, int flags,
    const char **acl_text, size_t *acl_text_len,
    struct archive_string_conv *sc)
{
	int count;
	size_t length;
	const char *name;
	const char *prefix;
	char separator;
	struct archive_acl_entry *ap;
	size_t len;
	int id, r;
	char *p;

	if (acl->acl_text != NULL) {
		free (acl->acl_text);
		acl->acl_text = NULL;
	}

	*acl_text = NULL;
	if (acl_text_len != NULL)
		*acl_text_len = 0;
	separator = ',';
	count = 0;
	length = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & flags) != 0) {
			count++;
			if ((flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT) &&
			    (ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT))
				length += 8; /* "default:" */
			length += 5; /* tag name */
			length += 1; /* colon */
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (len > 0 && name != NULL)
				length += len;
			else
				length += sizeof(uid_t) * 3 + 1;
			length ++; /* colon */
			length += 3; /* rwx */
			length += 1; /* colon */
			length += max(sizeof(uid_t), sizeof(gid_t)) * 3 + 1;
			length ++; /* newline */
		}
		ap = ap->next;
	}

	if (count > 0 && ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0)) {
		length += 10; /* "user::rwx\n" */
		length += 11; /* "group::rwx\n" */
		length += 11; /* "other::rwx\n" */
	}

	if (count == 0)
		return (0);

	/* Now, allocate the string and actually populate it. */
	p = acl->acl_text = (char *)malloc(length);
	if (p == NULL)
		return (-1);
	count = 0;
	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0) {
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_USER_OBJ, NULL,
		    acl->mode & 0700, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_GROUP_OBJ, NULL,
		    acl->mode & 0070, -1);
		*p++ = ',';
		append_entry(&p, NULL, ARCHIVE_ENTRY_ACL_OTHER, NULL,
		    acl->mode & 0007, -1);
		count += 3;

		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, NULL, ap->tag, name,
			    ap->permset, id);
			count++;
		}
	}


	if ((flags & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) != 0) {
		if (flags & ARCHIVE_ENTRY_ACL_STYLE_MARK_DEFAULT)
			prefix = "default:";
		else
			prefix = NULL;
		count = 0;
		for (ap = acl->acl_head; ap != NULL; ap = ap->next) {
			if ((ap->type & ARCHIVE_ENTRY_ACL_TYPE_DEFAULT) == 0)
				continue;
			r = archive_mstring_get_mbs_l(
			    &ap->name, &name, &len, sc);
			if (r != 0)
				return (-1);
			if (count > 0)
				*p++ = separator;
			if (flags & ARCHIVE_ENTRY_ACL_STYLE_EXTRA_ID)
				id = ap->id;
			else
				id = -1;
			append_entry(&p, prefix, ap->tag,
			    name, ap->permset, id);
			count ++;
		}
	}

	*acl_text = acl->acl_text;
	if (acl_text_len != NULL)
		*acl_text_len = strlen(acl->acl_text);
	return (0);
}